

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O3

BorderSpecs * __thiscall
sciplot::LineSpecsOf<sciplot::BorderSpecs>::lineColor
          (LineSpecsOf<sciplot::BorderSpecs> *this,string *value)

{
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  std::operator+(&local_58,"linecolor \'",value);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_28 = *plVar2;
    lStack_20 = plVar1[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar2;
    local_38 = (long *)*plVar1;
  }
  local_30 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_linecolor,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (BorderSpecs *)this;
}

Assistant:

auto LineSpecsOf<DerivedSpecs>::lineColor(std::string value) -> DerivedSpecs&
{
    m_linecolor = "linecolor '" + value + "'";
    return static_cast<DerivedSpecs&>(*this);
}